

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_print.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  kvtree *hash;
  int long_index;
  int local_4c;
  char *local_48;
  undefined8 local_40;
  undefined4 local_34;
  
  local_34 = 0;
  local_48 = (char *)0x0;
  local_4c = 0;
  bVar2 = false;
  while( true ) {
    do {
      bVar6 = bVar2;
      iVar3 = getopt_long(argc,argv,"m:h",main::long_options,&local_34);
      bVar2 = true;
    } while (iVar3 == 0x68);
    if (iVar3 == -1) break;
    if (iVar3 == 0x6d) {
      local_48 = strdup(_optarg);
      bVar2 = bVar6;
    }
    else {
      printf("ERROR: Unknown option: `%s\'\n",argv[(long)_optind + -1]);
      local_4c = 1;
      bVar2 = true;
    }
  }
  if ((!bVar6) && (argc - _optind != 1)) {
    puts("ERROR: Missing file name or too many files");
    bVar6 = true;
    local_4c = 1;
  }
  if (local_48 == (char *)0x0) {
    uVar5 = 1;
    goto LAB_0010132d;
  }
  iVar3 = strcmp(local_48,"tree");
  if (iVar3 == 0) {
LAB_00101312:
    uVar5 = 1;
  }
  else {
    iVar3 = strcmp(local_48,"keyval");
    if (iVar3 != 0) {
      printf("ERROR: Invalid mode name: `%s\'\n",local_48);
      bVar6 = true;
      local_4c = 1;
      goto LAB_00101312;
    }
    uVar5 = 2;
  }
  free(local_48);
LAB_0010132d:
  if (bVar6) {
    putchar(10);
    puts("Usage: kvtree_print [options] <file>");
    putchar(10);
    puts("  Options:");
    puts("    -m, --mode <mode>  Specify print format: \"tree\" or \"keyval\" (default tree)");
    puts("    -h, --help         Print usage");
    putchar(10);
  }
  else {
    pcVar1 = argv[_optind];
    uVar4 = kvtree_new();
    local_40 = uVar4;
    iVar3 = kvtree_read_file(pcVar1,uVar4);
    if (iVar3 == 0) {
      kvtree_print_mode(uVar4,0,uVar5);
    }
    else {
      printf("ERROR: Failed to read file: `%s\'\n",pcVar1);
      local_4c = 1;
    }
    kvtree_delete(&local_40);
  }
  return local_4c;
}

Assistant:

int main(int argc, char* argv[])
{
  int rc = 0;

  static const char *opt_string = "m:h";
  static struct option long_options[] = {
    {"mode",    required_argument, NULL, 'm'},
    {"help",    no_argument,       NULL, 'h'},
    {NULL,      no_argument,       NULL,   0}
  };

  int usage = 0;
  char* mode = NULL;

  int long_index = 0;
  while (1) {
    int c = getopt_long(argc, argv, opt_string, long_options, &long_index);
    if (c == -1) {
      break;
    }

    switch(c) {
      case 'm':
        mode = strdup(optarg);
        break;
      case 'h':
        usage = 1;
        break;
      default:
        printf("ERROR: Unknown option: `%s'\n", argv[optind-1]);
        usage = 1;
        rc = 1;
        break;
    }
  }

  /* check that we were given exactly one filename argument */
  int numargs = argc - optind;
  if (!usage && numargs != 1) {
    printf("ERROR: Missing file name or too many files\n");
    usage = 1;
    rc = 1;
  }

  /* parse the print mode option, if one is given */
  int print_mode = KVTREE_PRINT_TREE;
  if (mode != NULL) {
    if (strcmp(mode, "tree") == 0) {
      print_mode = KVTREE_PRINT_TREE;
    } else if (strcmp(mode, "keyval") == 0) {
      print_mode = KVTREE_PRINT_KEYVAL;
    } else {
      printf("ERROR: Invalid mode name: `%s'\n", mode);
      usage = 1;
      rc = 1;
    }
    free(mode);
  }

  if (usage) {
    print_usage();
    return rc;
  }

  /* get the file name */
  char* filename = argv[optind];

  /* read in the file */
  kvtree* hash = kvtree_new();
  if (kvtree_read_file(filename, hash) == KVTREE_SUCCESS) {
    /* we read the file, now print it out */
    kvtree_print_mode(hash, 0, print_mode);
  } else {
    printf("ERROR: Failed to read file: `%s'\n", filename);
    rc = 1;
  }
  kvtree_delete(&hash);

  return rc;
}